

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O3

void branch(vec<Branching_*> *x,VarBranch var_branch,ValBranch val_branch)

{
  Branching **ppBVar1;
  BranchGroup *pBVar2;
  BranchGroup *pBVar3;
  ulong uVar4;
  ulong uVar5;
  vec<Branching_*> local_38;
  
  pBVar2 = engine.branching;
  local_38.sz = x->sz;
  uVar5 = (ulong)local_38.sz;
  local_38.cap = local_38.sz;
  local_38.data = (Branching **)malloc(uVar5 * 8);
  if (uVar5 != 0) {
    ppBVar1 = x->data;
    uVar4 = 0;
    do {
      local_38.data[uVar4] = ppBVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  pBVar3 = createBranch(&local_38,var_branch,val_branch);
  (*(pBVar2->super_Branching)._vptr_Branching[3])(pBVar2,pBVar3);
  if (local_38.data != (Branching **)0x0) {
    free(local_38.data);
  }
  return;
}

Assistant:

void branch(vec<Branching*> x, VarBranch var_branch, ValBranch val_branch) {
	engine.branching->add(createBranch(x, var_branch, val_branch));
}